

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
array<vector3_base<int>,_allocator_default<vector3_base<int>_>_>::insert
          (array<vector3_base<int>,_allocator_default<vector3_base<int>_>_> *this,
          vector3_base<int> *item,range r)

{
  vector3_base<int> *pvVar1;
  anon_union_4_3_4e90b0cd_for_vector3_base<int>_3 aVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  int new_len;
  
  if (r.begin < r.end) {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                   ,0x96,1,"empty");
    iVar6 = (int)((long)r.begin - (long)this->list >> 2) * -0x55555555;
    uVar3 = this->list_size;
    uVar7 = this->num_elements;
    if (uVar7 == uVar3) {
      uVar3 = 1;
      if (1 < (int)uVar7) {
        uVar3 = uVar7 >> 1;
      }
      alloc(this,uVar3 + uVar7);
      uVar3 = this->list_size;
      uVar7 = this->num_elements;
    }
    new_len = uVar7 + 1;
    if ((int)uVar3 <= (int)uVar7) {
      alloc(this,new_len);
    }
    this->num_elements = new_len;
    if (iVar6 < (int)uVar7) {
      lVar4 = (long)(int)uVar7;
      lVar5 = lVar4 * 0xc;
      do {
        pvVar1 = this->list;
        *(anon_union_4_4_d826a04f_for_vector3_base<int>_5 *)((long)&pvVar1->field_2 + lVar5) =
             pvVar1[(long)new_len + -2].field_2;
        *(undefined8 *)((long)&pvVar1->field_0 + lVar5) =
             *(undefined8 *)(pvVar1 + (long)new_len + -2);
        lVar4 = lVar4 + -1;
        new_len = new_len + -1;
        lVar5 = lVar5 + -0xc;
      } while (iVar6 < lVar4);
    }
    pvVar1 = this->list;
    pvVar1[iVar6].field_2 = item->field_2;
    aVar2 = item->field_1;
    pvVar1 = pvVar1 + iVar6;
    pvVar1->field_0 = item->field_0;
    pvVar1->field_1 = aVar2;
    return this->num_elements + -1;
  }
  iVar6 = add(this,item);
  return iVar6;
}

Assistant:

int insert(const T& item, range r)
	{
		if(r.empty())
			return add(item);

		int index = (int)(&r.front()-list);
		incsize();
		set_size(size()+1);

		for(int i = num_elements-1; i > index; i--)
			list[i] = list[i-1];

		list[index] = item;

		return num_elements-1;
	}